

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obudec.c
# Opt level: O1

int obudec_read_leb128(AvxInputContext *input_ctx,uint8_t *value_buffer,size_t *value_length,
                      uint64_t *value,_Bool buffered)

{
  _Bool _Var1;
  undefined4 in_EAX;
  int iVar2;
  size_t sVar3;
  int iVar4;
  size_t available;
  undefined1 auVar5 [16];
  
  auVar5._0_4_ = -(uint)(input_ctx == (AvxInputContext *)0x0);
  auVar5._4_4_ = -(uint)(value_buffer == (uint8_t *)0x0);
  auVar5._8_4_ = -(uint)(value_length == (size_t *)0x0);
  auVar5._12_4_ = -(uint)(value == (uint64_t *)0x0);
  iVar2 = movmskps(in_EAX,auVar5);
  iVar4 = -1;
  if (iVar2 != 0) {
    return -1;
  }
  available = 0;
  do {
    sVar3 = buffer_input(input_ctx,1,value_buffer + available,buffered);
    if (sVar3 == 0) {
      iVar2 = 1;
      iVar4 = -1;
      if (available == 0) {
        _Var1 = input_eof(input_ctx);
        iVar2 = 1;
        if (_Var1) {
          available = 0;
          iVar4 = 0;
          goto LAB_00122e8f;
        }
      }
    }
    else if ((char)value_buffer[available] < '\0') {
      iVar2 = 0;
    }
    else {
      available = available + 1;
      iVar2 = 2;
LAB_00122e8f:
      *value_length = available;
    }
    if (iVar2 != 0) {
      if (iVar2 != 2) {
        return iVar4;
      }
      goto LAB_00122eda;
    }
    available = available + 1;
    if (7 < available) {
LAB_00122eda:
      iVar2 = aom_uleb_decode(value_buffer,available,value,(size_t *)0x0);
      return iVar2;
    }
  } while( true );
}

Assistant:

static int obudec_read_leb128(struct AvxInputContext *input_ctx,
                              uint8_t *value_buffer, size_t *value_length,
                              uint64_t *value, bool buffered) {
  if (!input_ctx || !value_buffer || !value_length || !value) return -1;
  size_t len;
  for (len = 0; len < OBU_MAX_LENGTH_FIELD_SIZE; ++len) {
    const size_t num_read =
        buffer_input(input_ctx, 1, &value_buffer[len], buffered);
    if (num_read == 0) {
      if (len == 0 && input_eof(input_ctx)) {
        *value_length = 0;
        return 0;
      }
      // Ran out of data before completing read of value.
      return -1;
    }
    if ((value_buffer[len] >> 7) == 0) {
      ++len;
      *value_length = len;
      break;
    }
  }

  return aom_uleb_decode(value_buffer, len, value, NULL);
}